

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_typed_token_attr<tinyusdz::CollectionInstance::ExpansionRule>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *attr,
                   string *name,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  ExpansionRule *pEVar3;
  AttrMeta *pAVar4;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this;
  size_type sVar5;
  const_reference v;
  uint32_t n;
  ExpansionRule rule;
  uint32_t n_00;
  uint32_t n_01;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_278;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *attr_local;
  
  local_24 = indent;
  psStack_20 = name;
  name_local = (string *)attr;
  attr_local = (TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *)
               __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::authored
                    ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *)
                     name_local);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)(ulong)local_24,n);
    ::std::operator<<(aoStack_1a0,(string *)&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    poVar2 = ::std::operator<<(aoStack_1a0,"uniform token ");
    ::std::operator<<(poVar2,(string *)psStack_20);
    bVar1 = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::is_blocked
                      ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *)
                       name_local);
    if (bVar1) {
      ::std::operator<<(aoStack_1a0," = None");
    }
    else {
      poVar2 = ::std::operator<<(aoStack_1a0," = ");
      pEVar3 = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::get_value
                         ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *
                          )name_local);
      to_string_abi_cxx11_(&local_210,(tinyusdz *)(ulong)*pEVar3,rule);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_230,"\"",&local_231);
      quote(&local_1f0,&local_210,&local_230);
      ::std::operator<<(poVar2,(string *)&local_1f0);
      ::std::__cxx11::string::~string((string *)&local_1f0);
      ::std::__cxx11::string::~string((string *)&local_230);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
      ::std::__cxx11::string::~string((string *)&local_210);
    }
    pAVar4 = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::metas
                       ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *)
                        name_local);
    bVar1 = AttrMetas::authored(pAVar4);
    if (bVar1) {
      poVar2 = ::std::operator<<(aoStack_1a0," (\n");
      pAVar4 = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::metas
                         ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *
                          )name_local);
      print_attr_metas_abi_cxx11_
                (&local_258,(tinyusdz *)pAVar4,(AttrMeta *)(ulong)(local_24 + 1),indent);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_258);
      pprint::Indent_abi_cxx11_(&local_278,(pprint *)(ulong)local_24,n_00);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_278);
      ::std::operator<<(poVar2,")");
      ::std::__cxx11::string::~string((string *)&local_278);
      ::std::__cxx11::string::~string((string *)&local_258);
    }
    ::std::operator<<(aoStack_1a0,"\n");
    bVar1 = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::has_connections
                      ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *)
                       name_local);
    if (bVar1) {
      pprint::Indent_abi_cxx11_((string *)&paths,(pprint *)(ulong)local_24,n_01);
      ::std::operator<<(aoStack_1a0,(string *)&paths);
      ::std::__cxx11::string::~string((string *)&paths);
      poVar2 = ::std::operator<<(aoStack_1a0,"token ");
      ::std::operator<<(poVar2,(string *)psStack_20);
      ::std::operator<<(aoStack_1a0,".connect = ");
      this = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::
             get_connections((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                              *)name_local);
      sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
      if (sVar5 == 1) {
        v = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this,0);
        ::std::operator<<(aoStack_1a0,v);
      }
      else {
        sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
        if (sVar5 == 0) {
          ::std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          ::std::operator<<(aoStack_1a0,this);
        }
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_token_attr(const TypedAttributeWithFallback<T> &attr,
                                   const std::string &name,
                                   const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    ss << pprint::Indent(indent);

    ss << "uniform token " << name;

    if (attr.is_blocked()) {
      ss << " = None";
    } else {
      ss << " = " << quote(to_string(attr.get_value()));
    }

    if (attr.metas().authored()) {
      ss << " (\n"
         << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
         << ")";
    }
    ss << "\n";

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);

      ss << "token " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }
  }

  return ss.str();
}